

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

void __thiscall
LogicalOperationNode::LogicalOperationNode
          (LogicalOperationNode *this,LogicalOperation operation_to,shared_ptr<Node> *lhs,
          shared_ptr<Node> *rhs)

{
  shared_ptr<Node> *rhs_local;
  shared_ptr<Node> *lhs_local;
  LogicalOperation operation_to_local;
  LogicalOperationNode *this_local;
  
  Node::Node(&this->super_Node);
  (this->super_Node)._vptr_Node = (_func_int **)&PTR_Evaluate_0013bc60;
  this->operation = operation_to;
  std::shared_ptr<Node>::shared_ptr(&this->lhs_node,lhs);
  std::shared_ptr<Node>::shared_ptr(&this->rhs_node,rhs);
  return;
}

Assistant:

LogicalOperationNode::LogicalOperationNode(const LogicalOperation operation_to,
                                           const shared_ptr<Node> &lhs, const shared_ptr<Node> &rhs)
        : operation(operation_to)
        , lhs_node(lhs)
        , rhs_node(rhs)
    {}